

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

iterator * __thiscall
google::protobuf::RepeatedFieldRef<google::protobuf::Message,_void>::begin
          (iterator *__return_storage_ptr__,RepeatedFieldRef<google::protobuf::Message,_void> *this)

{
  void *data;
  RepeatedFieldAccessor *accessor;
  Message *scratch_space;
  RepeatedFieldRef<google::protobuf::Message,_void> *this_local;
  
  data = this->data_;
  accessor = this->accessor_;
  scratch_space = NewMessage(this);
  internal::RepeatedFieldRefIterator<google::protobuf::Message>::RepeatedFieldRefIterator
            (__return_storage_ptr__,data,accessor,true,scratch_space);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() const {
    return iterator(data_, accessor_, true, NewMessage());
  }